

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

int __thiscall
xercesc_4_0::TraverseSchema::traverseComplexTypeDecl
          (TraverseSchema *this,DOMElement *elem,bool topLevel,XMLCh *recursingTypeName)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  SchemaInfo *pSVar3;
  XMLStringPool *pXVar4;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar5;
  ValueVectorOf<unsigned_int> *this_01;
  ComplexTypeInfo *pCVar6;
  undefined8 annotation;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  XMLCh *pXVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar15;
  XSDLocator *this_02;
  undefined4 extraout_var_01;
  DOMElement *pDVar16;
  DOMNode *node;
  XMLCh *pXVar17;
  short *psVar18;
  short *psVar19;
  long lVar20;
  long lVar21;
  short *psVar22;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar23;
  XMLSize_t XVar24;
  XMLCh XVar25;
  byte local_84;
  ComplexTypeInfo *local_80;
  uint local_74;
  XMLSize_t local_70;
  XMLCh anonCountStr [16];
  NamespaceScopeManager nsMgr;
  XMLCh *pXVar14;
  undefined4 extraout_var_02;
  
  pSVar3 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    nsMgr.fScopeAdded = false;
  }
  else {
    nsMgr.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  nsMgr.fSchemaInfo = pSVar3;
  pXVar13 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  if ((pXVar13 != (XMLCh *)0x0) && (*pXVar13 != L'\0')) {
    bVar8 = false;
    goto LAB_0032625e;
  }
  if (topLevel) {
    uVar9 = 0xffffffff;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0xe);
    goto LAB_0032691f;
  }
  if (recursingTypeName == (XMLCh *)0x0) {
    uVar9 = this->fAnonXSTypeCount;
    this->fAnonXSTypeCount = uVar9 + 1;
    XMLString::sizeToText((ulong)uVar9,anonCountStr,0xf,10,this->fMemoryManager);
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,(XMLCh *)fgAnonCNamePrefix);
    XMLBuffer::append(&this->fBuffer,anonCountStr);
    pXVar4 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4);
    iVar10 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4);
    pXVar13 = (XMLCh *)CONCAT44(extraout_var,iVar10);
    bVar8 = true;
    if (pXVar13 != (XMLCh *)0x0) goto LAB_0032625e;
    pXVar13 = (XMLCh *)0x0;
    XVar24 = 0;
  }
  else {
    bVar8 = false;
    pXVar13 = recursingTypeName;
LAB_0032625e:
    lVar21 = 0;
    do {
      psVar18 = (short *)((long)pXVar13 + lVar21);
      lVar21 = lVar21 + 2;
    } while (*psVar18 != 0);
    XVar24 = (lVar21 >> 1) - 1;
  }
  bVar7 = XMLChar1_0::isValidNCName(pXVar13,XVar24);
  if (!bVar7) {
    uVar9 = 0xffffffff;
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x35,L"complexType",
                      pXVar13,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_0032691f;
  }
  this_00 = &this->fBuffer;
  pXVar14 = this->fTargetNSURIString;
  (this->fBuffer).fIndex = 0;
  if ((pXVar14 == (XMLCh *)0x0) || (*pXVar14 == L'\0')) {
    XVar24 = 0;
  }
  else {
    XMLBuffer::append(this_00,pXVar14);
    XVar24 = this_00->fIndex;
  }
  if (XVar24 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar24 = this_00->fIndex;
  }
  (this->fBuffer).fIndex = XVar24 + 1;
  (this->fBuffer).fBuffer[XVar24] = L',';
  XMLBuffer::append(this_00,pXVar13);
  pXVar4 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  uVar9 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])();
  iVar10 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                     (this->fStringPool,(ulong)uVar9);
  pXVar14 = (XMLCh *)CONCAT44(extraout_var_00,iVar10);
  if (recursingTypeName != (XMLCh *)0x0 || topLevel) {
    pRVar5 = this->fComplexTypeRegistry;
    if ((pXVar14 == (XMLCh *)0x0) || (uVar15 = (ulong)(ushort)*pXVar14, uVar15 == 0)) {
      uVar15 = 0;
    }
    else {
      XVar25 = pXVar14[1];
      if (XVar25 != L'\0') {
        pXVar17 = pXVar14 + 2;
        do {
          uVar15 = (ulong)(ushort)XVar25 + (uVar15 >> 0x18) + uVar15 * 0x26;
          XVar25 = *pXVar17;
          pXVar17 = pXVar17 + 1;
        } while (XVar25 != L'\0');
      }
      uVar15 = uVar15 % pRVar5->fHashModulus;
    }
    pRVar23 = pRVar5->fBucketList[uVar15];
    if (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar7 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,pXVar14,pRVar23->fKey);
        if (bVar7) {
          local_80 = pRVar23->fData;
          if (local_80 != (ComplexTypeInfo *)0x0) {
            if (local_80->fPreprocessed == false) goto LAB_0032691f;
            local_70 = this->fCircularCheckIndex;
            local_74 = this->fCurrentScope;
            this->fCurrentScope = local_80->fScopeDefined;
            local_80->fPreprocessed = false;
            local_84 = 1;
            goto LAB_00326550;
          }
          break;
        }
        pRVar23 = pRVar23->fNext;
      } while (pRVar23 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
  }
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,topLevel ^ 0xd,this,topLevel,this->fNonXSAttList);
  local_70 = this->fCircularCheckIndex;
  local_74 = this->fCurrentScope;
  local_80 = (ComplexTypeInfo *)XMemory::operator_new(0xb0,this->fGrammarPoolMemoryManager);
  ComplexTypeInfo::ComplexTypeInfo(local_80,this->fGrammarPoolMemoryManager);
  if (bVar8) {
    local_80->fAnonymous = true;
  }
  uVar11 = this->fScopeCount;
  this->fScopeCount = uVar11 + 1;
  this->fCurrentScope = uVar11;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::put
            (this->fComplexTypeRegistry,pXVar14,local_80);
  ComplexTypeInfo::setTypeName(local_80,pXVar14);
  local_80->fScopeDefined = this->fCurrentScope;
  if (this->fFullConstraintChecking == true) {
    this_02 = (XSDLocator *)XMemory::operator_new(0x28,this->fGrammarPoolMemoryManager);
    XSDLocator::XSDLocator(this_02);
    pXVar4 = this->fStringPool;
    uVar11 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])
                       (pXVar4,this->fSchemaInfo->fCurrentSchemaURL);
    iVar10 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar11);
    XSDLocator::setValues
              (this_02,(XMLCh *)CONCAT44(extraout_var_01,iVar10),(XMLCh *)0x0,
               (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
               (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
    ComplexTypeInfo::setLocator(local_80,this_02);
  }
  local_84 = 0;
LAB_00326550:
  this_01 = this->fCurrentTypeNameStack;
  ValueVectorOf<unsigned_int>::ensureExtraCapacity(this_01,1);
  XVar24 = this_01->fCurCount;
  this_01->fCurCount = XVar24 + 1;
  this_01->fElemList[XVar24] = uVar9;
  pCVar6 = this->fCurrentComplexType;
  this->fCurrentComplexType = local_80;
  pDVar16 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  node = &checkContent(this,elem,pDVar16,true,(bool)(local_84 ^ 1))->super_DOMNode;
  anonCountStr._0_8_ = this->fAnnotation;
  if (((XSAnnotation *)anonCountStr._0_8_ == (XSAnnotation *)0x0 &
      this->fScanner->fGenerateSyntheticAnnotations) == 1) {
    if (this->fNonXSAttList->fCurCount == 0) {
      anonCountStr._0_8_ = (XSAnnotation *)0x0;
    }
    else {
      anonCountStr._0_8_ = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = (XSAnnotation *)anonCountStr._0_8_;
    }
  }
  pXVar17 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_MIXED,Boolean);
  if ((pXVar17 == (XMLCh *)0x0) || (*pXVar17 == L'\0')) {
LAB_0032667e:
    bVar8 = false;
  }
  else {
    if (pXVar17 != L"true") {
      lVar21 = 0;
      do {
        psVar18 = (short *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar21);
        if (*psVar18 == 0) {
          if ((pXVar17 == L"1") || (*(short *)((long)pXVar17 + lVar21) == 0)) goto LAB_00326683;
          goto LAB_00326671;
        }
        psVar19 = (short *)((long)pXVar17 + lVar21);
        lVar21 = lVar21 + 2;
      } while (*psVar18 == *psVar19);
      if (pXVar17 != L"1") {
LAB_00326671:
        if ((*pXVar17 != L'1') || (pXVar17[1] != L'\0')) goto LAB_0032667e;
      }
    }
LAB_00326683:
    bVar8 = true;
  }
  if (node == (DOMNode *)0x0) {
    processComplexContent(this,elem,pXVar13,(DOMElement *)0x0,local_80,(XMLCh *)0x0,bVar8,false);
  }
  else {
    iVar10 = (*node->_vptr_DOMNode[0x18])(node);
    psVar18 = (short *)CONCAT44(extraout_var_02,iVar10);
    if (psVar18 == &SchemaSymbols::fgELT_SIMPLECONTENT) {
LAB_00326730:
      traverseSimpleContentDecl
                (this,pXVar13,pXVar14,(DOMElement *)node,local_80,
                 (Janitor<xercesc_4_0::XSAnnotation> *)anonCountStr);
      pDVar16 = XUtil::getNextSiblingElement(node);
      iVar10 = 0x2d;
    }
    else {
      psVar19 = &SchemaSymbols::fgELT_SIMPLECONTENT;
      psVar22 = psVar18;
      if (psVar18 == (short *)0x0) {
LAB_003266f6:
        if (*psVar19 == 0) goto LAB_00326730;
      }
      else {
        do {
          sVar1 = *psVar22;
          if (sVar1 == 0) goto LAB_003266f6;
          sVar2 = *psVar19;
          psVar19 = psVar19 + 1;
          psVar22 = psVar22 + 1;
        } while (sVar1 == sVar2);
      }
      if (psVar18 != &SchemaSymbols::fgELT_COMPLEXCONTENT) {
        psVar19 = &SchemaSymbols::fgELT_COMPLEXCONTENT;
        if (psVar18 == (short *)0x0) {
LAB_0032675a:
          if (*psVar19 == 0) goto LAB_00326775;
        }
        else {
          do {
            sVar1 = *psVar18;
            if (sVar1 == 0) goto LAB_0032675a;
            psVar18 = psVar18 + 1;
            sVar2 = *psVar19;
            psVar19 = psVar19 + 1;
          } while (sVar1 == sVar2);
        }
        if (this->fCurrentGroupInfo == (XercesGroupInfo *)0x0) {
          processComplexContent
                    (this,elem,pXVar13,(DOMElement *)node,local_80,(XMLCh *)0x0,bVar8,false);
        }
        else {
          local_80->fPreprocessed = true;
        }
        goto LAB_003267b3;
      }
LAB_00326775:
      traverseComplexContentDecl
                (this,pXVar13,(DOMElement *)node,local_80,bVar8,
                 (Janitor<xercesc_4_0::XSAnnotation> *)anonCountStr);
      pDVar16 = XUtil::getNextSiblingElement(node);
      iVar10 = 0x2e;
    }
    if (pDVar16 != (DOMElement *)0x0) {
      reportSchemaError(this,(DOMElement *)node,L"http://apache.org/xml/messages/XMLErrors",iVar10);
    }
  }
LAB_003267b3:
  if (local_84 == 0) {
    pXVar13 = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_ABSTRACT,Boolean);
    iVar10 = parseBlockSet(this,elem,1,false);
    iVar12 = parseFinalSet(this,elem,3,false);
    local_80->fBlockSet = iVar10;
    local_80->fFinalSet = iVar12;
    if ((pXVar13 == (XMLCh *)0x0) || (XVar25 = *pXVar13, XVar25 == L'\0')) {
LAB_003268c1:
      bVar8 = false;
    }
    else {
      bVar8 = true;
      if (pXVar13 != L"true") {
        lVar21 = 0;
        do {
          lVar20 = lVar21;
          if (XVar25 != *(XMLCh *)((long)&SchemaSymbols::fgATTVAL_TRUE + lVar20)) {
            if (pXVar13 == L"1") goto LAB_003268c3;
            goto LAB_00326871;
          }
          XVar25 = *(XMLCh *)((long)pXVar13 + lVar20 + 2);
          lVar21 = lVar20 + 2;
        } while (XVar25 != L'\0');
        if ((pXVar13 != L"1") && (*(short *)((long)&DAT_003688bc + lVar20) != 0)) {
LAB_00326871:
          lVar21 = 0;
          do {
            psVar18 = (short *)((long)pXVar13 + lVar21);
            if (*psVar18 == 0) {
              if (*(short *)((long)&fgValueOne + lVar21) == 0) goto LAB_003268c3;
              break;
            }
            psVar19 = (short *)((long)&fgValueOne + lVar21);
            lVar21 = lVar21 + 2;
          } while (*psVar18 == *psVar19);
          goto LAB_003268c1;
        }
      }
    }
LAB_003268c3:
    local_80->fAbstract = bVar8;
  }
  annotation = anonCountStr._0_8_;
  if (anonCountStr._0_8_ != 0) {
    anonCountStr[0] = L'\0';
    anonCountStr[1] = L'\0';
    anonCountStr[2] = L'\0';
    anonCountStr[3] = L'\0';
    SchemaGrammar::putAnnotation(this->fSchemaGrammar,local_80,(XSAnnotation *)annotation);
  }
  XVar24 = this->fCurrentTypeNameStack->fCurCount;
  if (XVar24 != 0) {
    ValueVectorOf<unsigned_int>::removeElementAt(this->fCurrentTypeNameStack,XVar24 - 1);
  }
  this->fCircularCheckIndex = local_70;
  this->fCurrentScope = local_74;
  this->fCurrentComplexType = pCVar6;
LAB_0032691f:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return uVar9;
}

Assistant:

int TraverseSchema::traverseComplexTypeDecl(const DOMElement* const elem,
                                            const bool topLevel,
                                            const XMLCh* const recursingTypeName) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // Get the attributes of the complexType
    const XMLCh* name = getElementAttValue(elem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);
    bool isAnonymous = false;

    if (!name || !*name) {

        if (topLevel) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TopLevelNoNameComplexType);
            return -1;
        }

        if (recursingTypeName)
            name = recursingTypeName;
        else {
            name = genAnonTypeName(fgAnonCNamePrefix);
            isAnonymous = true;
        }
    }

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name)) ) {

        //REVISIT - Should we return or continue and save type with wrong name?
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_COMPLEXTYPE, name);
        return -1;
    }

    // ------------------------------------------------------------------
    // Check if the type has already been registered
    // ------------------------------------------------------------------
    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(name);

    int typeNameIndex = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* fullName = fStringPool->getValueForId(typeNameIndex);
    ComplexTypeInfo* typeInfo = 0;

    if (topLevel || recursingTypeName) {

        typeInfo = fComplexTypeRegistry->get(fullName);

        if (typeInfo && !typeInfo->getPreprocessed()) {
            return typeNameIndex;
        }
    }

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    bool preProcessFlag = (typeInfo) ? typeInfo->getPreprocessed() : false;
    if (!preProcessFlag) {
        fAttributeCheck.checkAttributes(
            elem, (topLevel) ? GeneralAttributeCheck::E_ComplexTypeGlobal
                             : GeneralAttributeCheck::E_ComplexTypeLocal
            , this, topLevel, fNonXSAttList
        );
    }

    // -----------------------------------------------------------------------
    // Create a new instance
    // -----------------------------------------------------------------------
    XMLSize_t previousCircularCheckIndex = fCircularCheckIndex;
    unsigned int previousScope = fCurrentScope;

    if (preProcessFlag) {

        fCurrentScope = typeInfo->getScopeDefined();
        typeInfo->setPreprocessed(false);
    }
    else {

        // ------------------------------------------------------------------
        // Register the type
        // ------------------------------------------------------------------
        typeInfo = new (fGrammarPoolMemoryManager) ComplexTypeInfo(fGrammarPoolMemoryManager);
        if(isAnonymous) {
            typeInfo->setAnonymous();
        }

        fCurrentScope = fScopeCount++;
        fComplexTypeRegistry->put((void*) fullName, typeInfo);
        typeInfo->setTypeName(fullName);
        typeInfo->setScopeDefined(fCurrentScope);

        if (fFullConstraintChecking) {

            XSDLocator* aLocator = new (fGrammarPoolMemoryManager) XSDLocator();
            aLocator->setValues(fStringPool->getValueForId(fStringPool->addOrFind(fSchemaInfo->getCurrentSchemaURL())),
                                0, ((XSDElementNSImpl*) elem)->getLineNo(),
                                ((XSDElementNSImpl*) elem)->getColumnNo());
            typeInfo->setLocator(aLocator);
        }
    }

    fCurrentTypeNameStack->addElement(typeNameIndex);
    ComplexTypeInfo* saveTypeInfo = fCurrentComplexType;
    fCurrentComplexType = typeInfo;

    // ------------------------------------------------------------------
    // First, handle any ANNOTATION declaration and get next child
    // ------------------------------------------------------------------
    DOMElement* child = checkContent(elem, XUtil::getFirstChildElement(elem), true, !preProcessFlag);

    if (fScanner->getGenerateSyntheticAnnotations() && !fAnnotation && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
    }
    Janitor<XSAnnotation> janAnnot(fAnnotation);

    // ------------------------------------------------------------------
    // Process the content of the complex type declaration
    // ------------------------------------------------------------------
    try {

        const XMLCh* mixedVal = getElementAttValue(elem,SchemaSymbols::fgATT_MIXED, DatatypeValidator::Boolean);
        bool isMixed = false;

        if ((mixedVal && *mixedVal)
            && (XMLString::equals(SchemaSymbols::fgATTVAL_TRUE, mixedVal)
                || XMLString::equals(fgValueOne, mixedVal))) {
            isMixed = true;
        }

        if (child == 0) {
            // EMPTY complexType with complexContent
            processComplexContent(elem, name, child, typeInfo, 0, isMixed);
        }
        else {

            const XMLCh* childName = child->getLocalName();

            if (XMLString::equals(childName, SchemaSymbols::fgELT_SIMPLECONTENT)) {

                // SIMPLE CONTENT element
                traverseSimpleContentDecl(name, fullName, child, typeInfo, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingSimpleContent);
                }
            }
            else if (XMLString::equals(childName, SchemaSymbols::fgELT_COMPLEXCONTENT)) {

                // COMPLEX CONTENT element
                traverseComplexContentDecl(name, child, typeInfo, isMixed, &janAnnot);

                if (XUtil::getNextSiblingElement(child) != 0) {
                    reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidChildFollowingConplexContent);
                }
            }
            else if (fCurrentGroupInfo) {
                typeInfo->setPreprocessed(true);
            }
            else {
                // We must have ....
                // GROUP, ALL, SEQUENCE or CHOICE, followed by optional attributes
                // Note that it's possible that only attributes are specified.
                processComplexContent(elem, name, child, typeInfo, 0, isMixed);
            }
        }
    }
    catch(const TraverseSchema::ExceptionCodes aCode) {
        if (aCode == TraverseSchema::InvalidComplexTypeInfo)
            defaultComplexTypeInfo(typeInfo);
        else if (aCode == TraverseSchema::RecursingElement)
            typeInfo->setPreprocessed();
    }

    // ------------------------------------------------------------------
    // Finish the setup of the typeInfo
    // ------------------------------------------------------------------
    if (!preProcessFlag) {

        const XMLCh* abstractAttVal = getElementAttValue(elem, SchemaSymbols::fgATT_ABSTRACT, DatatypeValidator::Boolean);
        int blockSet = parseBlockSet(elem, C_Block);
        int finalSet = parseFinalSet(elem, EC_Final);

        typeInfo->setBlockSet(blockSet);
        typeInfo->setFinalSet(finalSet);

        if ((abstractAttVal && *abstractAttVal)
            && (XMLString::equals(abstractAttVal, SchemaSymbols::fgATTVAL_TRUE)
                || XMLString::equals(abstractAttVal, fgValueOne))) {
            typeInfo->setAbstract(true);
        }
        else {
            typeInfo->setAbstract(false);
        }
    }

    // Store Annotation
    if (!janAnnot.isDataNull())
        fSchemaGrammar->putAnnotation(typeInfo, janAnnot.release());

    // ------------------------------------------------------------------
    // Before exiting, restore the scope, mainly for nested anonymous types
    // ------------------------------------------------------------------
    popCurrentTypeNameStack();
    fCircularCheckIndex = previousCircularCheckIndex;
    fCurrentScope = previousScope;
    fCurrentComplexType = saveTypeInfo;

    return typeNameIndex;
}